

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_frames_till_gf_update(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  
  if ((((int)in_RDI[0x782c] != 0) ||
      (iVar1 = is_frame_droppable((RTC_REF *)(*in_RDI + 0x14d68),
                                  (ExtRefreshFrameFlagsInfo *)((long)in_RDI + 0x42d84)), iVar1 != 0)
      ) && (0 < (int)in_RDI[0xc0f1])) {
    *(int *)(in_RDI + 0xc0f1) = (int)in_RDI[0xc0f1] + -1;
  }
  return;
}

Assistant:

static inline void update_frames_till_gf_update(AV1_COMP *cpi) {
  // TODO(weitinglin): Updating this counter for is_frame_droppable
  // is a work-around to handle the condition when a frame is drop.
  // We should fix the cpi->common.show_frame flag
  // instead of checking the other condition to update the counter properly.
  if (cpi->common.show_frame ||
      is_frame_droppable(&cpi->ppi->rtc_ref, &cpi->ext_flags.refresh_frame)) {
    // Decrement count down till next gf
    if (cpi->rc.frames_till_gf_update_due > 0)
      cpi->rc.frames_till_gf_update_due--;
  }
}